

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

AppendResult __thiscall
metaf::TrendGroup::append
          (TrendGroup *this,string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Type TVar4;
  optional<metaf::TrendGroup> nextGroup;
  _Storage<metaf::TrendGroup,_true> local_5c;
  char local_14;
  
  if (this->t == NOSIG) {
    return NOT_APPENDED;
  }
  parse((optional<metaf::TrendGroup> *)&local_5c._M_value,group,reportPart,reportMetadata);
  if (local_14 != '\x01') {
    return NOT_APPENDED;
  }
  TVar4 = this->t;
  if (this->prob == NONE || TVar4 != PROB) {
    if (TVar4 - BECMG < 3) {
      if (local_5c._M_value.t == TIME_SPAN) {
        if (local_5c._M_value.isTafTimeSpanGroup != true) {
          return NOT_APPENDED;
        }
        if (local_5c._M_value.prob != NONE) {
          return NOT_APPENDED;
        }
        if ((local_5c._28_4_ & 1) == 0) {
          return NOT_APPENDED;
        }
        if (((~local_5c._M_value.tTill.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload
               .super__Optional_payload_base<metaf::MetafTime>._M_engaged |
             local_5c._M_value.tAt.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_engaged) & 1U) != 0) {
          return NOT_APPENDED;
        }
      }
      else {
        if (2 < local_5c._M_value.t - FROM) {
          return NOT_APPENDED;
        }
        if (local_5c._M_value.prob != NONE) {
          return NOT_APPENDED;
        }
        if ((local_5c._28_4_ & 1) == 0) {
          if ((local_5c._48_4_ & 1) == 0) {
            if ((local_5c._68_4_ & 1) == 0) {
              return NOT_APPENDED;
            }
            goto LAB_001a4e82;
          }
        }
        else if ((local_5c._48_4_ & 1) != 0) {
          return NOT_APPENDED;
        }
        if ((local_5c._68_4_ & 1) != 0) {
          return NOT_APPENDED;
        }
      }
LAB_001a4e82:
      bVar1 = (this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
              super__Optional_payload_base<metaf::MetafTime>._M_engaged;
      if (((bVar1 & 1U) != 0) && ((local_5c._28_4_ & 1) != 0)) {
        return NOT_APPENDED;
      }
      bVar2 = (this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
              super__Optional_payload_base<metaf::MetafTime>._M_engaged;
      if (((bVar2 & 1U) != 0) && ((local_5c._48_4_ & 1) != 0)) {
        return NOT_APPENDED;
      }
      bVar3 = (this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
              super__Optional_payload_base<metaf::MetafTime>._M_engaged;
      if ((bVar3 & 1U) == 0) {
        if (((bVar2 | bVar1) &
             local_5c._M_value.tAt.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) != 0) {
          return NOT_APPENDED;
        }
      }
      else {
        if ((local_5c._68_4_ & 1) != 0) {
          return NOT_APPENDED;
        }
        if ((local_5c._28_4_ & 1) != 0) {
          return NOT_APPENDED;
        }
        if ((local_5c._48_4_ & 1) != 0) {
          return NOT_APPENDED;
        }
      }
      if ((bVar1 & 1U) == 0) {
        *(undefined4 *)
         &(this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._28_4_;
        (this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
        super__Optional_base<unsigned_int,_true,_true>._M_payload =
             (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._12_8_;
        *(undefined8 *)
         ((long)&(this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._20_8_;
      }
      if ((bVar2 & 1U) == 0) {
        *(undefined4 *)
         &(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._48_4_;
        (this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
        super__Optional_base<unsigned_int,_true,_true>._M_payload =
             (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._32_8_;
        *(undefined8 *)
         ((long)&(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._40_8_;
      }
      if ((bVar3 & 1U) != 0) {
        return APPENDED;
      }
      *(undefined4 *)
       &(this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._68_4_;
      (this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._52_8_;
      *(undefined8 *)
       ((long)&(this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._60_8_;
      return APPENDED;
    }
    if (local_5c._M_value.t != UNTIL || (this->prob != NONE || TVar4 != FROM)) {
      return NOT_APPENDED;
    }
    this->t = TIME_SPAN;
    (this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._32_8_;
    *(undefined8 *)
     ((long)&(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._40_8_;
    *(undefined4 *)
     &(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._48_4_;
  }
  else if ((((((((this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0) &&
              (((this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0)) &&
             (((this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0)) &&
            ((local_5c._M_value.t - BECMG < 3 && (local_5c._M_value.prob == NONE)))) &&
           (((local_5c._28_4_ & 1) == 0 &&
            ((BECMG < (uint)local_5c._0_4_ && ((local_5c._48_4_ & 1) == 0)))))) &&
          ((local_5c._68_4_ & 1) == 0)) {
    this->t = local_5c._M_value.t;
  }
  else {
    if (((this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) != 0) {
      return NOT_APPENDED;
    }
    if (((this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) != 0) {
      return NOT_APPENDED;
    }
    if (((this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) != 0) {
      return NOT_APPENDED;
    }
    if (local_5c._M_value.t != TIME_SPAN) {
      return NOT_APPENDED;
    }
    if (local_5c._M_value.isTafTimeSpanGroup != true) {
      return NOT_APPENDED;
    }
    if (local_5c._M_value.prob != NONE) {
      return NOT_APPENDED;
    }
    if ((local_5c._28_4_ & 1) == 0) {
      return NOT_APPENDED;
    }
    if ((local_5c._48_4_ & 1) == 0) {
      return NOT_APPENDED;
    }
    if ((local_5c._68_4_ & 1) != 0) {
      return NOT_APPENDED;
    }
    *(undefined4 *)
     &(this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._28_4_;
    (this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._12_8_;
    *(undefined8 *)
     ((long)&(this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._20_8_;
    (this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._32_8_;
    *(undefined8 *)
     ((long)&(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._40_8_;
    *(undefined4 *)
     &(this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._48_4_;
    *(undefined4 *)
     &(this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_engaged = local_5c._68_4_;
    (this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)local_5c._52_8_;
    *(undefined8 *)
     ((long)&(this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = local_5c._60_8_;
    this->t = TIME_SPAN;
  }
  return APPENDED;
}

Assistant:

AppendResult TrendGroup::append(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	if (type() == Type::NOSIG) return AppendResult::NOT_APPENDED;
	const auto nextGroup = parse(group, reportPart, reportMetadata);
	if (!nextGroup.has_value()) return AppendResult::NOT_APPENDED;
	if (combineProbAndTrendTypeGroups(*nextGroup)) return AppendResult::APPENDED;
	if (combineTrendTypeAndTimeGroup(*nextGroup)) return AppendResult::APPENDED;
	if (combineProbAndTimeSpanGroups(*nextGroup)) return AppendResult::APPENDED;
	if (combineIncompleteGroups(*nextGroup)) return AppendResult::APPENDED;
	return AppendResult::NOT_APPENDED;
}